

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O1

bool dxil_spv::emit_unpack4x8_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Builder *this;
  Operation *this_00;
  Value *value;
  Type *pTVar3;
  Operation *this_01;
  uint32_t signed_expand;
  uint32_t local_30;
  Capability local_2c;
  
  this = Converter::Impl::builder(impl);
  local_2c = CapabilityInt8;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,&local_2c);
  IVar2 = spv::Builder::makeIntegerType(this,8,false);
  IVar2 = spv::Builder::makeVectorType(this,IVar2,4);
  this_00 = Converter::Impl::allocate(impl,OpBitcast,IVar2);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar2 = Converter::Impl::get_id_for_value(impl,value,0);
  Operation::add_id(this_00,IVar2);
  Converter::Impl::add(impl,this_00,false);
  bVar1 = get_constant_operand(&instruction->super_Instruction,1,&local_30);
  if (bVar1) {
    pTVar3 = LLVMBC::Value::getType((Value *)instruction);
    pTVar3 = LLVMBC::Type::getStructElementType(pTVar3,0);
    IVar2 = Converter::Impl::get_type_id(impl,pTVar3,0);
    IVar2 = spv::Builder::makeVectorType(this,IVar2,4);
    this_01 = Converter::Impl::allocate
                        (impl,OpSConvert - (local_30 == 0),(Value *)instruction,IVar2);
    Operation::add_id(this_01,this_00->id);
    Converter::Impl::add(impl,this_01,false);
  }
  return bVar1;
}

Assistant:

bool emit_unpack4x8_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityInt8);

	auto *bitcast_op = impl.allocate(spv::OpBitcast, builder.makeVectorType(builder.makeUintType(8), 4));
	bitcast_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
	impl.add(bitcast_op);

	uint32_t signed_expand;
	if (!get_constant_operand(instruction, 1, &signed_expand))
		return false;

	auto *element_type = instruction->getType()->getStructElementType(0);
	spv::Id result_type = builder.makeVectorType(impl.get_type_id(element_type), 4);

	auto *expand_op = impl.allocate(signed_expand ? spv::OpSConvert : spv::OpUConvert,
	                                instruction, result_type);
	expand_op->add_id(bitcast_op->id);
	impl.add(expand_op);

	return true;
}